

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O2

Amap_Obj_t * Amap_ManCreatePo(Amap_Man_t *p,Amap_Obj_t *pFan0)

{
  uint uVar1;
  Amap_Obj_t *Entry;
  uint *puVar2;
  uint uVar3;
  
  Entry = Amap_ManSetupObj(p);
  *(ulong *)Entry =
       *(ulong *)Entry & 0xe0000000ffffffff | (ulong)(p->vPos->nSize & 0x1fffffff) << 0x20;
  Vec_PtrPush(p->vPos,Entry);
  *(ulong *)Entry = *(ulong *)Entry & 0xfffffffffffffff8 | 3;
  puVar2 = (uint *)((ulong)pFan0 & 0xfffffffffffffffe);
  Entry->Fan[0] = ((uint)pFan0 & 1) + (*puVar2 >> 3) * 2;
  puVar2[4] = puVar2[4] + 1;
  uVar1 = puVar2[2];
  Entry->Level = uVar1;
  uVar3 = p->nLevelMax;
  if (p->nLevelMax < (int)uVar1) {
    p->nLevelMax = uVar1;
    uVar3 = uVar1;
  }
  if ((int)uVar3 < 0xffe) {
    p->nObjs[3] = p->nObjs[3] + 1;
    return Entry;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/amap/amapGraph.c"
                ,0x79,"Amap_Obj_t *Amap_ManCreatePo(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

Amap_Obj_t * Amap_ManCreatePo( Amap_Man_t * p, Amap_Obj_t * pFan0 )
{
    Amap_Obj_t * pObj;
    pObj = Amap_ManSetupObj( p );
    pObj->IdPio  = Vec_PtrSize( p->vPos );
    Vec_PtrPush( p->vPos, pObj );
    pObj->Type   = AMAP_OBJ_PO;
    pObj->Fan[0] = Amap_ObjToLit(pFan0);  Amap_Regular(pFan0)->nRefs++;
    pObj->Level  = Amap_Regular(pFan0)->Level;
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
    p->nObjs[AMAP_OBJ_PO]++;
    return pObj;
}